

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O0

matrix<double> *
mat_lib::operator-(matrix<double> *__return_storage_ptr__,matrix<double> *a,matrix<double> *b)

{
  size_t sVar1;
  size_t sVar2;
  ostream *poVar3;
  invalid_argument *this;
  matrix<double> *m;
  undefined1 local_1f0 [8];
  matrix<double> c;
  string local_1c8 [48];
  ostringstream local_198 [8];
  ostringstream str_stream;
  matrix<double> *b_local;
  matrix<double> *a_local;
  
  sVar1 = matrix<double>::rows(a);
  sVar2 = matrix<double>::rows(b);
  if (sVar1 == sVar2) {
    sVar1 = matrix<double>::columns(a);
    sVar2 = matrix<double>::columns(b);
    if (sVar1 == sVar2) {
      matrix<double>::matrix((matrix<double> *)local_1f0,a);
      m = matrix<double>::operator-=((matrix<double> *)local_1f0,b);
      matrix<double>::matrix(__return_storage_ptr__,m);
      matrix<double>::~matrix((matrix<double> *)local_1f0);
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar3 = std::operator<<((ostream *)local_198,"size mismatch! cannot substract matrices (");
  poVar3 = std::operator<<(poVar3,"operator-");
  poVar3 = std::operator<<(poVar3,"() in ");
  poVar3 = std::operator<<(poVar3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/miguel-kjh[P]MatLibraryPy/matrix.hpp"
                          );
  poVar3 = std::operator<<(poVar3,":");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x222);
  std::operator<<(poVar3,")");
  c.elements__._7_1_ = 1;
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::invalid_argument::invalid_argument(this,local_1c8);
  c.elements__._7_1_ = 0;
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

matrix<T> operator-(const matrix<T>& a, const matrix<T>& b)
  {
    if((a.rows()!=b.rows()) || (a.columns()!=b.columns())) 
    {
      ostringstream str_stream;
      str_stream<<"size mismatch! cannot substract matrices ("
        <<__func__<<"() in "<<__FILE__<<":"<<__LINE__<<")";
      throw invalid_argument(str_stream.str());
    }

    matrix<T> c{a};
    return c-=b;
  }